

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

char * mtbdd_leaf_to_str(MTBDD leaf,char *buf,size_t buflen)

{
  uint32_t type_00;
  int iVar1;
  mtbddnode_t n_00;
  uint64_t value_00;
  char *pcVar2;
  int complement;
  uint64_t value;
  uint32_t type;
  mtbddnode_t n;
  size_t buflen_local;
  char *buf_local;
  MTBDD leaf_local;
  
  n_00 = MTBDD_GETNODE(leaf);
  type_00 = mtbddnode_gettype(n_00);
  value_00 = mtbddnode_getvalue(n_00);
  iVar1 = MTBDD_HASMARK(leaf);
  pcVar2 = sylvan_mt_to_str((uint)(iVar1 != 0),type_00,value_00,buf,buflen);
  return pcVar2;
}

Assistant:

char *
mtbdd_leaf_to_str(MTBDD leaf, char *buf, size_t buflen)
{
    mtbddnode_t n = MTBDD_GETNODE(leaf);
    uint32_t type = mtbddnode_gettype(n);
    uint64_t value = mtbddnode_getvalue(n);
    int complement = MTBDD_HASMARK(leaf) ? 1 : 0;

    return sylvan_mt_to_str(complement, type, value, buf, buflen);
}